

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastArgumentsLdElemI(Lowerer *this,Instr *ldElem,LabelInstr *labelFallThru)

{
  LowererMD *this_00;
  Func *func;
  RegOpnd *indexOpnd;
  code *pcVar1;
  LabelInstr *target;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  LabelInstr *notTaggedIntLabel;
  IntConstOpnd *pIVar7;
  IntConstOpnd *src1;
  undefined4 extraout_var;
  IndirOpnd *pIVar8;
  Instr *pIVar9;
  Opnd *src1_00;
  undefined4 extraout_var_00;
  AddrOpnd *pAVar10;
  undefined1 *puVar11;
  Func *pFVar12;
  Lowerer *pLVar13;
  IntConstType local_58;
  IntConstType value;
  Lowerer *local_48;
  LabelInstr *local_40;
  bool local_31 [8];
  bool isNotInt;
  
  local_40 = labelFallThru;
  bVar2 = IR::Instr::DoStackArgsOpt(ldElem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5697,"(ldElem->DoStackArgsOpt())","ldElem->DoStackArgsOpt()");
    if (!bVar2) goto LAB_005d18b4;
    *puVar6 = 0;
  }
  pIVar8 = (IndirOpnd *)ldElem->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)pIVar8);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) {
LAB_005d18b4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  local_48 = this;
  bVar2 = Func::IsInlinee(ldElem->m_func);
  func = ldElem->m_func;
  value = (IntConstType)IR::LabelInstr::New(Label,func,true);
  local_31[0] = false;
  local_58 = 0;
  indexOpnd = pIVar8->m_indexOpnd;
  bVar4 = IR::IndirOpnd::TryGetIntConstIndexValue(pIVar8,true,&local_58,local_31);
  if (local_31[0] != false) {
LAB_005d1896:
    puVar11 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar11 = 0x2a;
    __cxa_throw(puVar11,&Js::RejitException::typeinfo,0);
  }
  if (bVar4) {
    if (local_58 < 0) {
      pFVar12 = ldElem->m_func;
    }
    else {
      if (!bVar2) {
        if (local_40 == (LabelInstr *)0x0) goto LAB_005d1896;
        notTaggedIntLabel = IR::LabelInstr::New(Label,func,true);
LAB_005d1743:
        pLVar13 = local_48;
        this_00 = &local_48->m_lowererMD;
        pIVar9 = LowererMD::LoadInputParamCount(this_00,ldElem,-1,false);
        src1_00 = IR::Opnd::UseWithNewType(pIVar9->m_dst,TyInt32,pLVar13->m_func);
        if (bVar4) {
          pIVar7 = IR::IntConstOpnd::New(local_58,TyInt32,func,false);
        }
        else {
          pIVar7 = (IntConstOpnd *)
                   LowererMD::LoadNonnegativeIndex
                             (this_00,indexOpnd,(indexOpnd->super_Opnd).m_type == TyUint32,
                              notTaggedIntLabel,notTaggedIntLabel,ldElem);
        }
        pIVar9 = (Instr *)value;
        InsertCompare(src1_00,&pIVar7->super_Opnd,ldElem);
        InsertBranch(BrLe_A,true,notTaggedIntLabel,ldElem);
        pIVar8 = GetArgsIndirOpndForTopFunction(local_48,ldElem,&pIVar7->super_Opnd);
        goto LAB_005d17f8;
      }
      pFVar12 = ldElem->m_func;
      if (local_58 < (long)((ulong)pFVar12->actualCount - 1)) {
        if (local_40 == (LabelInstr *)0x0) goto LAB_005d1896;
        notTaggedIntLabel = IR::LabelInstr::New(Label,func,true);
        goto LAB_005d162b;
      }
    }
    iVar5 = (*pFVar12->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
    pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicVar,ldElem->m_func,
                                true,(Var)0x0);
    InsertMove(ldElem->m_dst,&pAVar10->super_Opnd,ldElem,true);
    InsertBranch(Br,false,local_40,ldElem);
  }
  else {
    if (local_40 == (LabelInstr *)0x0) goto LAB_005d1896;
    notTaggedIntLabel = IR::LabelInstr::New(Label,func,true);
    if (!bVar2) goto LAB_005d1743;
LAB_005d162b:
    pIVar7 = IR::IntConstOpnd::New((ulong)ldElem->m_func->actualCount - 1,TyInt32,func,false);
    pLVar13 = local_48;
    if (bVar4) {
      src1 = IR::IntConstOpnd::New(local_58,TyInt32,func,false);
      pLVar13 = local_48;
    }
    else {
      src1 = (IntConstOpnd *)
             LowererMD::LoadNonnegativeIndex
                       (&local_48->m_lowererMD,indexOpnd,(indexOpnd->super_Opnd).m_type == TyUint32,
                        notTaggedIntLabel,notTaggedIntLabel,ldElem);
      InsertCompare((Opnd *)src1,&pIVar7->super_Opnd,ldElem);
      InsertBranch(BrGe_A,true,notTaggedIntLabel,ldElem);
    }
    pIVar8 = GetArgsIndirOpndForInlinee(pLVar13,ldElem,&src1->super_Opnd);
    pIVar9 = (Instr *)value;
LAB_005d17f8:
    InsertMove(ldElem->m_dst,&pIVar8->super_Opnd,ldElem,true);
    target = local_40;
    InsertBranch(Br,false,local_40,ldElem);
    IR::Instr::InsertBefore(ldElem,&notTaggedIntLabel->super_Instr);
    iVar5 = (*ldElem->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
    pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar5),AddrOpndKindDynamicVar,
                                ldElem->m_func,true,(Var)0x0);
    InsertMove(ldElem->m_dst,&pAVar10->super_Opnd,ldElem,true);
    InsertBranch(Br,false,target,ldElem);
    IR::Instr::InsertBefore(ldElem,pIVar9);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastArgumentsLdElemI(IR::Instr* ldElem, IR::LabelInstr *labelFallThru)
{
    //  ---GenerateSmIntTest
    //  ---GenerateLdValueFromCheckedIndexOpnd
    //  ---LoadInputParamCount
    //  CMP actualParamOpnd, valueOpnd //Compare between the actual count & the index count (say i in arguments[i])
    //  JLE $labelReturnUndefined
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //  JMP $fallthrough
    //
    //labelReturnUndefined:
    //  MOV dst, undefined
    //  JMP $fallthrough
    //
    //labelCreateHeapArgs:
    //  ---Bail out to create Heap Arguments object

    Assert(ldElem->DoStackArgsOpt());

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    bool isInlinee = ldElem->m_func->IsInlinee();
    Func *func = ldElem->m_func;

    IR::LabelInstr *labelCreateHeapArgs = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // Now load the index and check if it is an integer.
    bool emittedFastPath = false;
    bool isNotInt = false;
    IntConstType   value = 0;
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd      *valueOpnd = nullptr;
    IR::Opnd      *actualParamOpnd = nullptr;

    bool hasIntConstIndex = indirOpnd->TryGetIntConstIndexValue(true, &value, &isNotInt);

    if (isNotInt)
    {
        //Not an int disable optimisation and rejit
    }
    else if (hasIntConstIndex && (value < 0 || (isInlinee && value >= (ldElem->m_func->actualCount - 1))))
    {
        // if the index is an int const outside the range then the value must be undefined
        // this is ensured as GlobOpt::OptArguments disables the Arguments optimisation if the arguments object is modified
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
        emittedFastPath = true;
    }
    else if (labelFallThru != nullptr)
    {
        IR::LabelInstr *labelReturnUndefined = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        if (isInlinee)
        {
            actualParamOpnd = IR::IntConstOpnd::New(ldElem->m_func->actualCount - 1, TyInt32, func);
        }
        else
        {
            // Load actuals count, LoadHeapArguments will reuse the generated instructions here
            IR::Instr      *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldElem, -1 /* don't include 'this' while counting actuals. */);
            actualParamOpnd = loadInputParamCountInstr->GetDst()->UseWithNewType(TyInt32,this->m_func);
        }

        if (hasIntConstIndex)
        {
            //Constant index
            valueOpnd = IR::IntConstOpnd::New(value, TyInt32, func);
        }
        else
        {
            //Load valueOpnd from the index, note this operation includes a bail-out for non-integer indices
            valueOpnd =
                m_lowererMD.LoadNonnegativeIndex(
                    indexOpnd,
                    (
#if INT32VAR
                        indexOpnd->GetType() == TyUint32
#else
                        // On 32-bit platforms, skip the negative check since for now, the unsigned upper bound check covers it
                        true
#endif
                        ),
                    labelReturnUndefined,
                    labelReturnUndefined,
                    ldElem);
        }

        if (isInlinee)
        {
            if (!hasIntConstIndex)
            {
                //Runtime check to make sure length is within the arguments.length range.
                GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, valueOpnd, actualParamOpnd, Js::OpCode::BrGe_A);
            }
        }
        else
        {
            GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, actualParamOpnd, valueOpnd, Js::OpCode::BrLe_A);
        }

        IR::Opnd *argIndirOpnd = nullptr;
        if (isInlinee)
        {
            argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, valueOpnd);
        }
        else
        {
            argIndirOpnd = GetArgsIndirOpndForTopFunction(ldElem, valueOpnd);
        }

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // if load is outside of range at runtime return false
        ldElem->InsertBefore(labelReturnUndefined);
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // $labelCreateHeapArgs:
        ldElem->InsertBefore(labelCreateHeapArgs);
        emittedFastPath = true;
    }

    if (!emittedFastPath)
    {
        throw Js::RejitException(RejitReason::DisableStackArgOpt);
    }

    return emittedFastPath;
}